

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_constraints.c
# Opt level: O0

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,N_Vector atol)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar3;
  undefined8 in_XMM1_Qa;
  sunrealtype err;
  N_Vector ewt;
  N_Vector ref;
  int passfail;
  uint local_4;
  
  plVar1 = (long *)N_VClone(in_RDI);
  uVar2 = N_VClone(in_RDI);
  **(undefined8 **)(*plVar1 + 0x10) = 0x3e6bf64d19675e2c;
  *(undefined8 *)(*(long *)(*plVar1 + 0x10) + 8) = 0x3d4d5205eff51f97;
  *(undefined8 *)(*(long *)(*plVar1 + 0x10) + 0x10) = 0x3fefffffe409aba4;
  N_VAbs(plVar1,uVar2);
  N_VLinearSum(in_XMM1_Qa,0x4024000000000000,uVar2,in_RSI,uVar2);
  dVar3 = (double)N_VMin(uVar2);
  if (0.0 < dVar3) {
    N_VInv(uVar2,uVar2);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RDI,plVar1,plVar1);
    dVar3 = (double)N_VWrmsNorm(plVar1,uVar2);
    local_4 = (uint)(1.0 <= dVar3);
    if (local_4 != 0) {
      fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",dVar3);
    }
    N_VDestroy(plVar1);
    N_VDestroy(uVar2);
  }
  else {
    fprintf(_stderr,"\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, N_Vector atol)
{
  int passfail = 0; /* answer pass (0) or fail (1) flag */
  N_Vector ref;     /* reference solution vector        */
  N_Vector ewt;     /* error weight vector              */
  sunrealtype err;  /* wrms error                       */

  /* create reference solution and error weight vectors */
  ref = N_VClone(y);
  ewt = N_VClone(y);

  /* set the reference solution data */
  NV_Ith_S(ref, 0) = SUN_RCONST(5.2083495894337328e-08);
  NV_Ith_S(ref, 1) = SUN_RCONST(2.0833399429795671e-13);
  NV_Ith_S(ref, 2) = SUN_RCONST(9.9999994791629776e-01);

  /* compute the error weight vector, loosen atol */
  N_VAbs(ref, ewt);
  N_VLinearSum(rtol, ewt, SUN_RCONST(10.0), atol, ewt);
  if (N_VMin(ewt) <= ZERO)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n");
    return (-1);
  }
  N_VInv(ewt, ewt);

  /* compute the solution error */
  N_VLinearSum(ONE, y, -ONE, ref, ref);
  err = N_VWrmsNorm(ref, ewt);

  /* is the solution within the tolerances? */
  passfail = (err < ONE) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  /* Free vectors */
  N_VDestroy(ref);
  N_VDestroy(ewt);

  return (passfail);
}